

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O0

QString * QStandardPaths::displayName(StandardLocation type)

{
  undefined4 in_ESI;
  QString *in_RDI;
  int in_stack_00000044;
  char *in_stack_00000048;
  char *in_stack_00000050;
  char *in_stack_000000b8;
  
  switch(in_ESI) {
  case 0:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 1:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 2:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 3:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 4:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 5:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 6:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 7:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 8:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 9:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 10:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0xb:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0xc:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0xd:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0xe:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0xf:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0x10:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0x11:
  case 0x12:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0x13:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0x14:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0x15:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  case 0x16:
    QCoreApplication::translate
              (in_stack_00000050,in_stack_000000b8,in_stack_00000048,in_stack_00000044);
    break;
  default:
    QString::QString((QString *)0x2f28a7);
  }
  return in_RDI;
}

Assistant:

QString QStandardPaths::displayName(StandardLocation type)
{
    switch (type) {
    case DesktopLocation:
        return QCoreApplication::translate("QStandardPaths", "Desktop");
    case DocumentsLocation:
        return QCoreApplication::translate("QStandardPaths", "Documents");
    case FontsLocation:
        return QCoreApplication::translate("QStandardPaths", "Fonts");
    case ApplicationsLocation:
        return QCoreApplication::translate("QStandardPaths", "Applications");
    case MusicLocation:
        return QCoreApplication::translate("QStandardPaths", "Music");
    case MoviesLocation:
        return QCoreApplication::translate("QStandardPaths", "Movies");
    case PicturesLocation:
        return QCoreApplication::translate("QStandardPaths", "Pictures");
    case TempLocation:
        return QCoreApplication::translate("QStandardPaths", "Temporary Directory");
    case HomeLocation:
        return QCoreApplication::translate("QStandardPaths", "Home");
    case AppLocalDataLocation:
        return QCoreApplication::translate("QStandardPaths", "Application Data");
    case CacheLocation:
        return QCoreApplication::translate("QStandardPaths", "Cache");
    case StateLocation:
        return QCoreApplication::translate("QStandardPaths", "State");
    case GenericDataLocation:
        return QCoreApplication::translate("QStandardPaths", "Shared Data");
    case RuntimeLocation:
        return QCoreApplication::translate("QStandardPaths", "Runtime");
    case ConfigLocation:
        return QCoreApplication::translate("QStandardPaths", "Configuration");
    case GenericConfigLocation:
        return QCoreApplication::translate("QStandardPaths", "Shared Configuration");
    case GenericCacheLocation:
        return QCoreApplication::translate("QStandardPaths", "Shared Cache");
    case GenericStateLocation:
        return QCoreApplication::translate("QStandardPaths", "Shared State");
    case DownloadLocation:
        return QCoreApplication::translate("QStandardPaths", "Download");
    case AppDataLocation:
    case AppConfigLocation:
        return QCoreApplication::translate("QStandardPaths", "Application Configuration");
    case PublicShareLocation:
        return QCoreApplication::translate("QStandardPaths", "Public");
    case TemplatesLocation:
        return QCoreApplication::translate("QStandardPaths", "Templates");
    }
    // not reached
    return QString();
}